

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

ostream * __thiscall smf::Options::printRegister(Options *this,ostream *out)

{
  bool bVar1;
  reference ppOVar2;
  __normal_iterator<smf::Option_register_**,_std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>_>
  local_28;
  __normal_iterator<smf::Option_register_**,_std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>_>
  local_20;
  iterator it;
  ostream *out_local;
  Options *this_local;
  
  it._M_current = (Option_register **)out;
  local_20._M_current =
       (Option_register **)
       std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::begin
                 (&this->m_optionRegister);
  while( true ) {
    local_28._M_current =
         (Option_register **)
         std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::end
                   (&this->m_optionRegister);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppOVar2 = __gnu_cxx::
              __normal_iterator<smf::Option_register_**,_std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>_>
              ::operator*(&local_20);
    Option_register::print(*ppOVar2,(ostream *)it._M_current);
    __gnu_cxx::
    __normal_iterator<smf::Option_register_**,_std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>_>
    ::operator++(&local_20,0);
  }
  return (ostream *)it._M_current;
}

Assistant:

std::ostream& Options::printRegister(std::ostream& out) {
   for (auto it = m_optionRegister.begin(); it != m_optionRegister.end(); it++) {
      (*it)->print(out);
   }
   return out;
}